

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamReader.h
# Opt level: O2

void __thiscall
Assimp::StreamReader<false,_false>::StreamReader
          (StreamReader<false,_false> *this,shared_ptr<Assimp::IOStream> *stream,bool le)

{
  std::__shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2> *)this,
             &stream->super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>);
  this->le = le;
  if ((stream->super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
      (element_type *)0x0) {
    InternBegin(this);
    return;
  }
  __assert_fail("stream",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/include/assimp/StreamReader.h"
                ,0x62,
                "Assimp::StreamReader<>::StreamReader(std::shared_ptr<IOStream>, bool) [SwapEndianess = false, RuntimeSwitch = false]"
               );
}

Assistant:

StreamReader(std::shared_ptr<IOStream> stream, bool le = false)
        : stream(stream)
        , le(le)
    {
        ai_assert(stream);
        InternBegin();
    }